

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindowPrivate::setVisible(QWidgetWindowPrivate *this,bool visible)

{
  long lVar1;
  long lVar2;
  QDebug QVar3;
  char cVar4;
  QLoggingCategory *pQVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebug local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar5 = QtPrivateLogging::lcWidgetShowHide();
  if (((pQVar5->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    QVar3.stream = local_60.stream;
    QVar7.m_data = (storage_type *)0x15;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_60.stream,' ');
    }
    *(int *)((QTextStream *)local_60.stream + 0x28) =
         *(int *)((QTextStream *)local_60.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_50,(QWidget *)local_58);
    QVar3.stream = local_50.stream;
    QVar8.m_data = (storage_type *)0x2;
    QVar8.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    pcVar6 = "false";
    if (visible) {
      pcVar6 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,pcVar6);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QVar3.stream = local_50.stream;
    QVar9.m_data = (storage_type *)0x18;
    QVar9.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug(&local_60);
  }
  lVar2 = *(long *)(lVar1 + 0x28);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (lVar1 = *(long *)(lVar1 + 0x30), lVar1 != 0)
      ) && ((bool)(*(byte *)(*(long *)(lVar1 + 0x20) + 9) >> 7) != visible)) {
    (**(code **)(**(long **)(lVar1 + 8) + 0x20))(*(long **)(lVar1 + 8),visible);
  }
  cVar4 = QWindow::isVisible();
  if ((bool)cVar4 != visible) {
    QWindowPrivate::setVisible(SUB81(this,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setVisible(bool visible) override
    {
        Q_Q(QWidgetWindow);
        qCDebug(lcWidgetShowHide) << "Setting visibility of" << q->widget()
               << "to" << visible << "via QWidgetWindowPrivate";

        if (QWidget *widget = q->widget()) {
            // If the widget's visible state is already matching the new QWindow
            // visible state we assume the widget has already synced up.
            if (visible != widget->isVisible())
                QWidgetPrivate::get(widget)->setVisible(visible);
        }

        // If we end up calling QWidgetPrivate::setVisible() above, we will
        // in most cases recurse back into setNativeWindowVisibility() to
        // update the QWindow state. But during QWidget::destroy() this is
        // not the case, as Qt::WA_WState_Created has been unset by the time
        // we check if we should call hide_helper(). We handle this case, as
        // well as the cases where we don't call QWidgetPrivate::setVisible(),
        // by syncing up the QWindow state here if needed.
        if (q->isVisible() != visible)
            QWindowPrivate::setVisible(visible);
    }